

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ContinuousQuantileFunction::Deserialize
          (Deserializer *deserializer,AggregateFunction *function)

{
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  value_type *input_type;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *bind_data;
  AggregateFunction *in_stack_fffffffffffffe78;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> this;
  LogicalType *in_stack_fffffffffffffe98;
  AggregateFunction *in_stack_ffffffffffffff70;
  Deserializer *in_stack_ffffffffffffff78;
  
  this._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  QuantileBindData::Deserialize(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  vector<duckdb::LogicalType,_true>::operator[]
            ((vector<duckdb::LogicalType,_true> *)this._M_head_impl,
             (size_type)in_stack_fffffffffffffe78);
  GetAggregate(in_stack_fffffffffffffe98);
  AggregateFunction::operator=((AggregateFunction *)this._M_head_impl,in_stack_fffffffffffffe78);
  AggregateFunction::~AggregateFunction((AggregateFunction *)this._M_head_impl);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto bind_data = QuantileBindData::Deserialize(deserializer, function);

		auto &input_type = function.arguments[0];
		function = GetAggregate(input_type);
		return bind_data;
	}